

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionScreenText::Drawer(DIntermissionScreenText *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  FRemapTable *pFVar9;
  undefined4 extraout_var;
  int local_58;
  int startx;
  int cy;
  int cx;
  int rowpadding;
  int rowheight;
  int numrows;
  int kerning;
  char *ch;
  FRemapTable *range;
  long lStack_28;
  int c;
  size_t count;
  FTexture *pFStack_18;
  int w;
  FTexture *pic;
  DIntermissionScreenText *this_local;
  
  pic = (FTexture *)this;
  DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
  if (this->mTextDelay <= (this->super_DIntermissionScreen).mTicker) {
    _numrows = this->mText;
    iVar3 = FFont::GetDefaultKerning(SmallFont);
    rowpadding = 1;
    for (range._4_4_ = 0; _numrows[range._4_4_] != '\0'; range._4_4_ = range._4_4_ + 1) {
      rowpadding = (uint)(_numrows[range._4_4_] == '\n') + rowpadding;
    }
    iVar4 = FFont::GetHeight(SmallFont);
    iVar4 = iVar4 * CleanYfac;
    iVar5 = -1;
    if ((gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) {
      iVar5 = 3;
    }
    cy = iVar5 * CleanYfac;
    iVar5 = (this->mTextX + -0xa0) * CleanXfac;
    iVar6 = DCanvas::GetWidth((DCanvas *)screen);
    iVar5 = iVar5 + iVar6 / 2;
    local_58 = (this->mTextY + -100) * CleanYfac;
    iVar6 = DCanvas::GetHeight((DCanvas *)screen);
    local_58 = local_58 + iVar6 / 2;
    while( true ) {
      bVar2 = false;
      if (0 < cy) {
        iVar6 = DCanvas::GetHeight((DCanvas *)screen);
        bVar2 = iVar6 < (local_58 + rowpadding * (iVar4 + cy)) - cy;
      }
      if (!bVar2) break;
      cy = cy + -1;
    }
    iVar6 = DCanvas::GetHeight((DCanvas *)screen);
    if (iVar6 < (local_58 + rowpadding * (iVar4 + cy)) - cy) {
      iVar6 = DCanvas::GetHeight((DCanvas *)screen);
      local_58 = (iVar6 - (rowpadding * (iVar4 + cy) - cy)) / 2;
      if (local_58 < 0) {
        local_58 = 0;
      }
    }
    iVar6 = (this->super_DIntermissionScreen).mTicker;
    iVar8 = this->mTextDelay;
    iVar1 = this->mTextSpeed;
    pFVar9 = FFont::GetColorTranslation(SmallFont,this->mTextColor);
    startx = iVar5;
    for (lStack_28 = (long)((iVar6 - iVar8) / iVar1); lStack_28 != 0; lStack_28 = lStack_28 + -1) {
      uVar7 = (uint)*_numrows;
      if (uVar7 == 0) {
        return;
      }
      if (uVar7 == 10) {
        local_58 = cy + iVar4 + local_58;
        startx = iVar5;
      }
      else {
        iVar6 = (*SmallFont->_vptr_FFont[2])(SmallFont,(ulong)uVar7,(long)&count + 4);
        pFStack_18 = (FTexture *)CONCAT44(extraout_var,iVar6);
        count._4_4_ = CleanXfac * (iVar3 + count._4_4_);
        iVar6 = startx + count._4_4_;
        iVar8 = DCanvas::GetWidth((DCanvas *)screen);
        if (iVar6 <= iVar8) {
          if (pFStack_18 != (FTexture *)0x0) {
            DCanvas::DrawTexture
                      ((DCanvas *)screen,pFStack_18,(double)startx,(double)local_58,0x4000138e,
                       pFVar9,0x40001393,1,0);
          }
          startx = count._4_4_ + startx;
        }
      }
      _numrows = _numrows + 1;
    }
  }
  return;
}

Assistant:

void DIntermissionScreenText::Drawer ()
{
	Super::Drawer();
	if (mTicker >= mTextDelay)
	{
		FTexture *pic;
		int w;
		size_t count;
		int c;
		const FRemapTable *range;
		const char *ch = mText;
		const int kerning = SmallFont->GetDefaultKerning();

		// Count number of rows in this text. Since it does not word-wrap, we just count
		// line feed characters.
		int numrows;

		for (numrows = 1, c = 0; ch[c] != '\0'; ++c)
		{
			numrows += (ch[c] == '\n');
		}

		int rowheight = SmallFont->GetHeight() * CleanYfac;
		int rowpadding = (gameinfo.gametype & (GAME_DoomStrifeChex) ? 3 : -1) * CleanYfac;

		int cx = (mTextX - 160)*CleanXfac + screen->GetWidth() / 2;
		int cy = (mTextY - 100)*CleanYfac + screen->GetHeight() / 2;
		int startx = cx;

		// Does this text fall off the end of the screen? If so, try to eliminate some margins first.
		while (rowpadding > 0 && cy + numrows * (rowheight + rowpadding) - rowpadding > screen->GetHeight())
		{
			rowpadding--;
		}
		// If it's still off the bottom, try to center it vertically.
		if (cy + numrows * (rowheight + rowpadding) - rowpadding > screen->GetHeight())
		{
			cy = (screen->GetHeight() - (numrows * (rowheight + rowpadding) - rowpadding)) / 2;
			// If it's off the top now, you're screwed. It's too tall to fit.
			if (cy < 0)
			{
				cy = 0;
			}
		}
		rowheight += rowpadding;

		// draw some of the text onto the screen
		count = (mTicker - mTextDelay) / mTextSpeed;
		range = SmallFont->GetColorTranslation (mTextColor);

		for ( ; count > 0 ; count-- )
		{
			c = *ch++;
			if (!c)
				break;
			if (c == '\n')
			{
				cx = startx;
				cy += rowheight;
				continue;
			}

			pic = SmallFont->GetChar (c, &w);
			w += kerning;
			w *= CleanXfac;
			if (cx + w > SCREENWIDTH)
				continue;
			if (pic != NULL)
			{
				screen->DrawTexture (pic,
					cx,
					cy,
					DTA_Translation, range,
					DTA_CleanNoMove, true,
					TAG_DONE);
			}
			cx += w;
		}
	}
}